

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_js_api_json_autogen.cpp
# Opt level: O0

VerifyEcdsaAdaptorRequestStruct * __thiscall
cfd::js::api::json::VerifyEcdsaAdaptorRequest::ConvertToStruct
          (VerifyEcdsaAdaptorRequestStruct *__return_storage_ptr__,VerifyEcdsaAdaptorRequest *this)

{
  VerifyEcdsaAdaptorRequest *this_local;
  VerifyEcdsaAdaptorRequestStruct *result;
  
  VerifyEcdsaAdaptorRequestStruct::VerifyEcdsaAdaptorRequestStruct(__return_storage_ptr__);
  std::__cxx11::string::operator=
            ((string *)__return_storage_ptr__,(string *)&this->adaptor_signature_);
  std::__cxx11::string::operator=((string *)&__return_storage_ptr__->proof,(string *)&this->proof_);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->adaptor,(string *)&this->adaptor_);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->message,(string *)&this->message_);
  __return_storage_ptr__->is_hashed = (bool)(this->is_hashed_ & 1);
  std::__cxx11::string::operator=
            ((string *)&__return_storage_ptr__->pubkey,(string *)&this->pubkey_);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&__return_storage_ptr__->ignore_items,&this->ignore_items);
  return __return_storage_ptr__;
}

Assistant:

VerifyEcdsaAdaptorRequestStruct VerifyEcdsaAdaptorRequest::ConvertToStruct() const {  // NOLINT
  VerifyEcdsaAdaptorRequestStruct result;
  result.adaptor_signature = adaptor_signature_;
  result.proof = proof_;
  result.adaptor = adaptor_;
  result.message = message_;
  result.is_hashed = is_hashed_;
  result.pubkey = pubkey_;
  result.ignore_items = ignore_items;
  return result;
}